

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O2

void bandit::use_default_reporters(choice_options *choices)

{
  option_map *this;
  allocator local_e9;
  string local_e8;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string((string *)&local_e8,"singleline",&local_e9);
  this = &choices->reporters;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:64:41)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:64:41)>
             ::_M_manager;
  detail::option_map::add(this,&local_e8,(controller_func_t *)&local_28,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_e8,"xunit",&local_e9);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:67:36)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:67:36)>
             ::_M_manager;
  detail::option_map::add(this,&local_e8,(controller_func_t *)&local_48,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_e8,"info",&local_e9);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:70:35)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:70:35)>
             ::_M_manager;
  detail::option_map::add(this,&local_e8,(controller_func_t *)&local_68,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_e8,"spec",&local_e9);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:73:35)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:73:35)>
             ::_M_manager;
  detail::option_map::add(this,&local_e8,(controller_func_t *)&local_88,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_e8,"crash",&local_e9);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:76:36)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:76:36)>
             ::_M_manager;
  detail::option_map::add(this,&local_e8,(controller_func_t *)&local_a8,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&local_e8,"dots",&local_e9);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:79:35)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:79:35)>
             ::_M_manager;
  detail::option_map::add(this,&local_e8,(controller_func_t *)&local_c8,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

inline void use_default_reporters(detail::choice_options& choices) {
    choices.reporters.add("singleline", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::singleline(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("xunit", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::xunit(controller.get_formatter()));
    });
    choices.reporters.add("info", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::info(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("spec", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::spec(controller.get_formatter(), controller.get_colorizer()));
    });
    choices.reporters.add("crash", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::crash(controller.get_formatter()));
    });
    choices.reporters.add("dots", [&](detail::controller_t& controller) {
      controller.set_reporter(new bandit::reporter::dots(controller.get_formatter(), controller.get_colorizer()));
    }, true);
  }